

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::TextBasedObject::TextBasedObject(TextBasedObject *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  TextBasedObject *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  DescriptiveObject::DescriptiveObject(&this->super_DescriptiveObject,d);
  (this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__TextBasedObject_0033baf0;
  UL::UL(&this->PayloadSchemeID);
  UTF16String::UTF16String(&this->TextMIMEMediaType);
  UTF16String::UTF16String(&this->RFC5646TextLanguageCode);
  optional_property<ASDCP::MXF::UTF16String>::optional_property(&this->TextDataDescription);
  if ((this->super_DescriptiveObject).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_DescriptiveObject).super_InterchangeObject.m_Dict,
                           MDD_TextBasedObject);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x12a0,"ASDCP::MXF::TextBasedObject::TextBasedObject(const Dictionary *)");
}

Assistant:

TextBasedObject::TextBasedObject(const Dictionary* d) : DescriptiveObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_TextBasedObject);
}